

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Type.cpp
# Opt level: O0

Type * slang::ast::Type::fromLookupResult
                 (Compilation *compilation,LookupResult *result,SourceRange sourceRange,
                 ASTContext *context)

{
  SourceRange sourceRange_00;
  bool bVar1;
  Type *this;
  ElementSelectSyntax *syntax;
  undefined8 *in_RSI;
  Compilation *in_RDI;
  SyntaxNode *unaff_retaddr;
  EvaluatedDimension *in_stack_00000008;
  EvaluatedDimension dim;
  ElementSelectSyntax *selectSyntax;
  size_t i;
  size_t count;
  Type *finalType;
  Symbol *symbol;
  bool local_a9;
  bitmask<slang::ast::ASTFlags> *in_stack_ffffffffffffff58;
  bitmask<slang::ast::ASTFlags> *in_stack_ffffffffffffff60;
  ASTContext *in_stack_ffffffffffffff68;
  SourceLocation in_stack_ffffffffffffff70;
  SourceLocation in_stack_ffffffffffffff78;
  undefined8 in_stack_ffffffffffffff80;
  DiagCode code;
  ElementSelectSyntax *pEVar2;
  ASTContext *in_stack_ffffffffffffff88;
  LookupResult *in_stack_ffffffffffffff90;
  bitmask<slang::ast::ASTFlags> local_40;
  int *local_38;
  undefined8 *local_28;
  Compilation *local_20;
  Type *local_8;
  
  code = SUB84((ulong)in_stack_ffffffffffffff80 >> 0x20,0);
  local_38 = (int *)*in_RSI;
  if (local_38 == (int *)0x0) {
    local_8 = Compilation::getErrorType(in_RDI);
  }
  else {
    local_28 = in_RSI;
    local_20 = in_RDI;
    bVar1 = Symbol::isType((Symbol *)0x4e8564);
    if (bVar1) {
      this = Symbol::as<slang::ast::Type>((Symbol *)0x4e8683);
      syntax = (ElementSelectSyntax *)
               SmallVectorBase<std::variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>_>
               ::size((SmallVectorBase<std::variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>_>
                       *)(local_28 + 3));
      for (pEVar2 = (ElementSelectSyntax *)0x0; local_8 = this, pEVar2 < syntax;
          pEVar2 = (ElementSelectSyntax *)((long)&(pEVar2->super_SyntaxNode).kind + 1)) {
        SmallVectorBase<std::variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>_>
        ::operator[]((SmallVectorBase<std::variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>_>
                      *)(local_28 + 3),(long)syntax + (-1 - (long)pEVar2));
        std::
        get<slang::syntax::ElementSelectSyntax_const*,slang::syntax::ElementSelectSyntax_const*,slang::ast::LookupResult::MemberSelector>
                  ((variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
                    *)0x4e86de);
        ASTContext::evalPackedDimension((ASTContext *)this,syntax);
        not_null<const_slang::ast::Scope_*>::operator*
                  ((not_null<const_slang::ast::Scope_*> *)0x4e870a);
        this = PackedArrayType::fromSyntax
                         ((Scope *)dim._8_8_,(Type *)dim._0_8_,in_stack_00000008,unaff_retaddr);
      }
    }
    else {
      local_a9 = false;
      if (*local_38 == 0x26) {
        bitmask<slang::ast::ASTFlags>::bitmask(&local_40,AllowNetType);
        local_a9 = bitmask<slang::ast::ASTFlags>::has
                             (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
      }
      if (local_a9 == false) {
        sourceRange_00.endLoc = in_stack_ffffffffffffff78;
        sourceRange_00.startLoc = in_stack_ffffffffffffff70;
        ASTContext::addDiag(in_stack_ffffffffffffff68,code,sourceRange_00);
        Diagnostic::operator<<
                  ((Diagnostic *)in_stack_ffffffffffffff90,*(string_view *)(local_38 + 2));
        local_8 = Compilation::getErrorType(local_20);
      }
      else {
        LookupResult::errorIfSelectors(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
        Symbol::as<slang::ast::NetType>((Symbol *)0x4e85dc);
        local_8 = NetType::getDataType((NetType *)0x4e85e4);
      }
    }
  }
  return local_8;
}

Assistant:

const Type& Type::fromLookupResult(Compilation& compilation, const LookupResult& result,
                                   SourceRange sourceRange, const ASTContext& context) {
    const Symbol* symbol = result.found;
    if (!symbol)
        return compilation.getErrorType();

    if (!symbol->isType()) {
        if (symbol->kind == SymbolKind::NetType && context.flags.has(ASTFlags::AllowNetType)) {
            result.errorIfSelectors(context);
            return symbol->as<NetType>().getDataType();
        }

        context.addDiag(diag::NotAType, sourceRange) << symbol->name;
        return compilation.getErrorType();
    }

    const Type* finalType = &symbol->as<Type>();
    size_t count = result.selectors.size();
    for (size_t i = 0; i < count; i++) {
        // It's not possible to have dotted selectors here because the Lookup
        // operation will error if we try to dot into a type, and will only
        // return selectors if the symbol is value-like, in which case we will
        // fail the isType() check above.
        auto selectSyntax = std::get<const ElementSelectSyntax*>(result.selectors[count - i - 1]);
        auto dim = context.evalPackedDimension(*selectSyntax);
        finalType = &PackedArrayType::fromSyntax(*context.scope, *finalType, dim, *selectSyntax);
    }

    return *finalType;
}